

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
::~QExplicitlySharedDataPointerV2
          (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
           *this)

{
  QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>
  *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>
                 *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>
                     *)0x0) {
        std::
        _Rb_tree<QByteArray,_std::pair<const_QByteArray,_int>,_std::_Select1st<std::pair<const_QByteArray,_int>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>
        ::_M_erase(&(pQVar1->m)._M_t,
                   (_Link_type)(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      }
      operator_delete(pQVar1,0x38);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }